

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::init(BlitFboCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *pMVar1;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *pMVar2;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  pointer *ppBVar3;
  int iVar4;
  Context *this_01;
  RenderContext *renderCtx;
  pointer __a;
  pointer pBVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  ContextType ctxType;
  deUint32 dVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  deBool dVar14;
  RenderTarget *pRVar15;
  undefined4 extraout_var;
  ObjectWrapper *pOVar16;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ShaderProgram *pSVar18;
  undefined4 extraout_var_04;
  pointer extraout_RAX;
  ulong uVar19;
  pointer pBVar20;
  pointer pBVar21;
  NotSupportedError *pNVar22;
  TestError *this_02;
  int i;
  char *in_RCX;
  uint uVar23;
  long lVar24;
  BlitArgs *__args;
  BlitArgs *extraout_RDX;
  BlitArgs *__args_00;
  uint uVar25;
  char *pcVar26;
  ulong uVar27;
  char *pcVar28;
  EVP_PKEY_CTX *ctx_00;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  pointer pBVar35;
  bool bVar36;
  float __tmp_1;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float __tmp;
  Random rnd;
  BlitArgs args;
  Vector<int,_2> local_278;
  value_type local_270;
  ulong local_250;
  Vector<int,_2> local_248;
  value_type local_240;
  deRandom local_220;
  ulong local_210;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  bool local_1c8;
  ios_base local_190 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_178;
  undefined1 local_158 [216];
  string local_80;
  string local_60;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_40;
  
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = pRVar15->m_numSamples;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar33 = CONCAT44(extraout_var,iVar9);
  deRandom_init(&local_220,0xabc123);
  local_208 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_200,"Using BlitFramebuffer to blit area from ",0x28);
  bVar36 = this->m_src == TARGET_DEFAULT;
  pcVar26 = "fbo";
  pcVar28 = "fbo";
  if (bVar36) {
    pcVar28 = "default fb";
  }
  lVar24 = 3;
  if (bVar36) {
    lVar24 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,pcVar28,lVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200," to ",4);
  bVar36 = this->m_dst == TARGET_DEFAULT;
  if (bVar36) {
    pcVar26 = "default fb";
  }
  lVar24 = 3;
  if (bVar36) {
    lVar24 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,pcVar26,lVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_200,
             "Varying blit arguments and primitive bounding box between iterations.\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_200,"Expecting bounding box to have no effect on blitting.\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_200,"Source framebuffer is filled with green-yellow grid.\n",0x35);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_200);
  std::ios_base::~ios_base(local_190);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar36 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar36) &&
     (bVar36 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_primitive_bounding_box"), !bVar36)) {
    pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_208 = (undefined1  [8])&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Test requires GL_EXT_primitive_bounding_box extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_208);
    __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((1 < iVar4) && (this->m_dst == TARGET_DEFAULT)) {
    pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_208 = (undefined1  [8])&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Test requires non-multisampled default framebuffer","");
    tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_208);
    __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_src == TARGET_FBO) {
    pOVar16 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar17 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar16,(Functions *)CONCAT44(extraout_var_00,iVar9),pOVar17);
    local_208 = (undefined1  [8])0x0;
    pMVar1 = &this->m_srcRbo;
    if (&((this->m_srcRbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar16) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&pMVar1->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      (pMVar1->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar16;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)local_208);
    (**(code **)(lVar33 + 0xa0))
              (0x8d41,(((pMVar1->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar10 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar10,"src rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd39);
    pOVar16 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar17 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar16,(Functions *)CONCAT44(extraout_var_01,iVar9),pOVar17);
    local_208 = (undefined1  [8])0x0;
    pMVar2 = &this->m_srcFbo;
    if (&((this->m_srcFbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar16) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&pMVar2->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      (pMVar2->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar16;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)local_208);
    (**(code **)(lVar33 + 0x78))
              (0x8d40,(((pMVar2->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((pMVar1->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ).m_data.ptr)->super_ObjectWrapper).m_object);
    dVar10 = (**(code **)(lVar33 + 0x800))();
    in_RCX = (char *)0xd3e;
    glu::checkError(dVar10,"src fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd3e);
  }
  if (this->m_dst == TARGET_FBO) {
    pOVar16 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar17 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar16,(Functions *)CONCAT44(extraout_var_02,iVar9),pOVar17);
    local_208 = (undefined1  [8])0x0;
    pMVar1 = &this->m_dstRbo;
    if (&((this->m_dstRbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar16) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&pMVar1->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      (pMVar1->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar16;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)local_208);
    (**(code **)(lVar33 + 0xa0))
              (0x8d41,(((pMVar1->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar10 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar10,"dst rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd46);
    pOVar16 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar17 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar16,(Functions *)CONCAT44(extraout_var_03,iVar9),pOVar17);
    local_208 = (undefined1  [8])0x0;
    pMVar2 = &this->m_dstFbo;
    if (&((this->m_dstFbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar16) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&pMVar2->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      (pMVar2->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar16;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)local_208);
    (**(code **)(lVar33 + 0x78))
              (0x8d40,(((pMVar2->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((pMVar1->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ).m_data.ptr)->super_ObjectWrapper).m_object);
    dVar10 = (**(code **)(lVar33 + 0x800))();
    in_RCX = (char *)0xd4b;
    glu::checkError(dVar10,"dst fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd4b);
  }
  pSVar18 = (ShaderProgram *)operator_new(0xd0);
  this_01 = (this->super_TestCase).m_context;
  renderCtx = this_01->m_renderCtx;
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  memset(local_208,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)this_01,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}\n"
             ,in_RCX);
  local_248.m_data[0] = 0;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + (ulong)(uint)local_248.m_data[0] * 0x18),&local_240);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_80,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_position;\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main()\n{\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tdEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n}\n"
             ,in_RCX);
  local_278.m_data[0] = 1;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + (ulong)(uint)local_278.m_data[0] * 0x18),&local_270);
  glu::ShaderProgram::ShaderProgram(pSVar18,renderCtx,(ProgramSources *)local_208);
  local_40.m_data.ptr = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      pSVar18) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_00->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = pSVar18;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar24 = 0x78;
  do {
    ctx_00 = (EVP_PKEY_CTX *)(local_208 + lVar24);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ctx_00);
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  pSVar18 = (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
            .m_data.ptr;
  if ((pSVar18->m_program).m_info.linkOk != false) {
    if (Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords == '\0') {
      _GLOBAL__N_1::BlitFboCase::init(ctx_00);
    }
    pOVar16 = (ObjectWrapper *)operator_new(0x18);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar17 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar16,(Functions *)CONCAT44(extraout_var_04,iVar9),pOVar17);
    local_208 = (undefined1  [8])0x0;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar16) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&(this->m_vbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this->m_vbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)pOVar16;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_208);
    (**(code **)(lVar33 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x150))(0x8892,0x40,init::s_quadCoords,0x88e4);
    dVar10 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar10,"set buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd77);
    uVar25 = 0x100;
    uVar32 = 0x100;
    local_248.m_data[1] = 0x100;
    if (this->m_src == TARGET_DEFAULT) {
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      uVar32 = pRVar15->m_width;
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_248.m_data[1] = pRVar15->m_height;
    }
    local_278.m_data[1] = 0x100;
    local_248.m_data[0] = uVar32;
    if (this->m_dst == TARGET_DEFAULT) {
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      uVar25 = pRVar15->m_width;
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_278.m_data[1] = pRVar15->m_height;
    }
    local_208 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_278.m_data[0] = uVar25;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_200);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,"srcSize = ",10);
    tcu::operator<<((ostream *)&uStack_200,&local_248);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,"dstSize = ",10);
    tcu::operator<<((ostream *)&uStack_200,&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_200,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_200);
    std::ios_base::~ios_base(local_190);
    local_250 = 0;
    do {
      iVar9 = local_248.m_data[0];
      local_1d8 = (pointer)0x0;
      uStack_1d0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      uStack_1e0 = (pointer)0x0;
      local_1f8._M_allocated_capacity = 0;
      local_1f8._8_8_ = (pointer)0x0;
      local_208 = (undefined1  [8])0x0;
      uStack_200 = (pointer)0x0;
      if ((iVar4 < 2) || (this->m_src != TARGET_DEFAULT)) {
        dVar10 = deRandom_getUint32(&local_220);
        iVar7 = local_248.m_data[1];
        dVar11 = deRandom_getUint32(&local_220);
        iVar6 = local_248.m_data[0];
        dVar12 = deRandom_getUint32(&local_220);
        iVar29 = local_248.m_data[1];
        uVar31 = dVar12 % (iVar6 - dVar10 % (uint)iVar9);
        dVar12 = deRandom_getUint32(&local_220);
        iVar6 = local_278.m_data[0];
        uVar23 = dVar12 % (iVar29 - dVar11 % (uint)iVar7);
        dVar12 = deRandom_getUint32(&local_220);
        iVar29 = local_278.m_data[1];
        uVar32 = dVar12 % (uint)iVar6;
        dVar12 = deRandom_getUint32(&local_220);
        iVar6 = local_278.m_data[0];
        uVar25 = dVar12 % (uint)iVar29;
        dVar12 = deRandom_getUint32(&local_220);
        local_210 = (ulong)(uint)local_278.m_data[1];
        dVar13 = deRandom_getUint32(&local_220);
        iVar29 = (int)(uVar25 + 1) / 2;
        iVar30 = (int)(uVar32 + 1) / 2;
        local_1f8._M_allocated_capacity._0_4_ =
             dVar12 % (iVar6 + (iVar30 - ((int)((uVar32 - ((int)(uVar32 + 2) >> 0x1f)) + 2) >> 1)) +
                      1U) - iVar30;
        local_1f8._M_allocated_capacity._4_4_ =
             dVar13 % ((int)local_210 +
                       (iVar29 - ((int)((uVar25 - ((int)(uVar25 + 2) >> 0x1f)) + 2) >> 1)) + 1U) -
             iVar29;
        local_208._4_4_ = uVar23;
        local_208._0_4_ = uVar31;
        uStack_200 = (pointer)CONCAT44(dVar11 % (uint)iVar7 + 1 + uVar23,
                                       dVar10 % (uint)iVar9 + 1 + uVar31);
        local_1f8._12_4_ = local_1f8._M_allocated_capacity._4_4_ + uVar25 + 1;
        local_1f8._8_4_ = local_1f8._M_allocated_capacity._0_4_ + uVar32 + 1;
      }
      else {
        uVar32 = local_278.m_data[0];
        if (local_248.m_data[0] < local_278.m_data[0]) {
          uVar32 = local_248.m_data[0];
        }
        uVar25 = local_278.m_data[1];
        if (local_248.m_data[1] < local_278.m_data[1]) {
          uVar25 = local_248.m_data[1];
        }
        dVar10 = deRandom_getUint32(&local_220);
        dVar11 = deRandom_getUint32(&local_220);
        dVar12 = deRandom_getUint32(&local_220);
        dVar13 = deRandom_getUint32(&local_220);
        local_208._0_4_ = dVar12 % (uVar32 - dVar10 % uVar32);
        local_208._4_4_ = dVar13 % (uVar25 - dVar11 % uVar25);
        local_1f8._8_4_ = dVar10 % uVar32 + 1 + local_208._0_4_;
        local_1f8._12_4_ = dVar11 % uVar25 + 1 + local_208._4_4_;
        uStack_200 = (pointer)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        local_1f8._M_allocated_capacity._4_4_ = local_208._4_4_;
        local_1f8._M_allocated_capacity._0_4_ = local_208._0_4_;
      }
      fVar37 = deRandom_getFloat(&local_220);
      fVar38 = fVar37 * 2.2 + -1.1;
      local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,fVar38);
      fVar37 = deRandom_getFloat(&local_220);
      local_1e8._4_4_ = fVar37 * 2.2 + -1.1;
      fVar37 = deRandom_getFloat(&local_220);
      uStack_1e0 = (pointer)CONCAT44(uStack_1e0._4_4_,fVar37 * 2.2 + -1.1);
      fVar37 = deRandom_getFloat(&local_220);
      fVar39 = fVar37 * 0.20000005 + 0.9;
      uStack_1e0._4_4_ = fVar39;
      fVar37 = deRandom_getFloat(&local_220);
      fVar40 = fVar37 * 2.2 + -1.1;
      local_1d8 = (pointer)CONCAT44(local_1d8._4_4_,fVar40);
      fVar37 = deRandom_getFloat(&local_220);
      local_1d8._4_4_ = fVar37 * 2.2 + -1.1;
      fVar37 = deRandom_getFloat(&local_220);
      uStack_1d0 = (pointer)CONCAT44(uStack_1d0._4_4_,fVar37 * 2.2 + -1.1);
      fVar41 = deRandom_getFloat(&local_220);
      fVar8 = (float)uStack_1e0;
      fVar37 = local_1e8._4_4_;
      fVar41 = fVar41 * 0.20000005 + 0.9;
      if (fVar40 / fVar41 < fVar38 / fVar39) {
        local_1e8._0_4_ = fVar40;
        local_1d8._0_4_ = fVar38;
      }
      if (local_1d8._4_4_ / fVar41 < local_1e8._4_4_ / uStack_1e0._4_4_) {
        local_1e8._4_4_ = local_1d8._4_4_;
        local_1d8._4_4_ = fVar37;
      }
      if ((float)uStack_1d0 / fVar41 < (float)uStack_1e0 / uStack_1e0._4_4_) {
        uStack_1e0._0_4_ = (float)uStack_1d0;
        uStack_1d0._0_4_ = fVar8;
      }
      uStack_1d0 = (pointer)CONCAT44(fVar41,(float)uStack_1d0);
      dVar14 = deRandom_getBool(&local_220);
      local_1c8 = dVar14 == 1;
      __a = (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (__a == (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pBVar5 = (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__a - (long)pBVar5 == 0x7fffffffffffffc4) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar33 = (long)__a - (long)pBVar5 >> 2;
        uVar34 = lVar33 * -0xf0f0f0f0f0f0f0f;
        uVar19 = uVar34;
        if (__a == pBVar5) {
          uVar19 = 1;
        }
        uVar27 = uVar19 + uVar34;
        if (0x1e1e1e1e1e1e1e0 < uVar27) {
          uVar27 = 0x1e1e1e1e1e1e1e1;
        }
        if (CARRY8(uVar19,uVar34)) {
          uVar27 = 0x1e1e1e1e1e1e1e1;
        }
        if (uVar27 == 0) {
          pBVar20 = (pointer)0x0;
          __args_00 = __args;
        }
        else {
          pBVar20 = (pointer)operator_new(uVar27 * 0x44);
          __args_00 = extraout_RDX;
        }
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs_const&>
                  ((allocator_type *)((pBVar20->src).m_data + lVar33),(BlitArgs *)local_208,
                   __args_00);
        pBVar35 = pBVar20;
        for (pBVar21 = pBVar5; __a != pBVar21; pBVar21 = pBVar21 + 1) {
          lVar33 = 0;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar21->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar33 = 4;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar21->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 8);
          lVar33 = 8;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar21->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 0xc);
          lVar33 = 0xc;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar21->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 0x10);
          pBVar35->linear = pBVar21->linear;
          pBVar35 = pBVar35 + 1;
        }
        if (pBVar5 != (pointer)0x0) {
          operator_delete(pBVar5,(long)(this->m_iterations).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pBVar5);
        }
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_start = pBVar20;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar35 + 1;
        pBVar20 = pBVar20 + uVar27;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar20;
      }
      else {
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs_const&>
                  ((allocator_type *)__a,(BlitArgs *)local_208,__args);
        ppBVar3 = &(this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar3 = *ppBVar3 + 1;
        pBVar20 = extraout_RAX;
      }
      uVar32 = (int)local_250 + 1;
      local_250 = (ulong)uVar32;
    } while (uVar32 != 0xc);
    return (int)pBVar20;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar18);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  local_208 = (undefined1  [8])&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"failed to build program","");
  tcu::TestError::TestError(this_02,(string *)local_208);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BlitFboCase::init (void)
{
	const int				numIterations			= 12;
	const bool				defaultFBMultisampled	= (m_context.getRenderTarget().getNumSamples() > 1);
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	de::Random				rnd						(0xABC123);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Using BlitFramebuffer to blit area from "
			<< ((m_src == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< " to "
			<< ((m_dst == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< ".\n"
		<< "Varying blit arguments and primitive bounding box between iterations.\n"
		<< "Expecting bounding box to have no effect on blitting.\n"
		<< "Source framebuffer is filled with green-yellow grid.\n"
		<< tcu::TestLog::EndMessage;

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_dst == TARGET_DEFAULT && defaultFBMultisampled)
		throw tcu::NotSupportedError("Test requires non-multisampled default framebuffer");

	// resources

	if (m_src == TARGET_FBO)
	{
		m_srcRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_srcRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src rbo");

		m_srcFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_srcFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_srcRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src fbo");
	}

	if (m_dst == TARGET_FBO)
	{
		m_dstRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_dstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst rbo");

		m_dstFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_dstFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_dstRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst fbo");
	}

	{
		const char* const vertexSource =	"${GLSL_VERSION_DECL}\n"
													"in highp vec4 a_position;\n"
													"out highp vec4 v_position;\n"
													"void main()\n"
													"{\n"
													"	gl_Position = a_position;\n"
													"	v_position = a_position;\n"
													"}\n";
		const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"in mediump vec4 v_position;\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main()\n"
													"{\n"
													"	const mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
													"	const mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"	dEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n"
													"}\n";

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, vertexSource)) << glu::FragmentSource(specializeShader(m_context, fragmentSource))));

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("failed to build program");
		}
	}

	{
		static const tcu::Vec4 s_quadCoords[] =
		{
			tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		};

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));

		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set buf");
	}

	// gen iterations

	{
		const tcu::IVec2 srcSize = (m_src == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));
		const tcu::IVec2 dstSize = (m_dst == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "srcSize = " << srcSize << "\n"
			<< "dstSize = " << dstSize << "\n"
			<< tcu::TestLog::EndMessage;

		for (int ndx = 0; ndx < numIterations; ++ndx)
		{
			BlitArgs args;

			if (m_src == TARGET_DEFAULT && defaultFBMultisampled)
			{
				const tcu::IVec2	unionSize	= tcu::IVec2(de::min(srcSize.x(), dstSize.x()), de::min(srcSize.y(), dstSize.y()));
				const int			srcWidth	= rnd.getInt(1, unionSize.x());
				const int			srcHeight	= rnd.getInt(1, unionSize.y());
				const int			srcX		= rnd.getInt(0, unionSize.x() - srcWidth);
				const int			srcY		= rnd.getInt(0, unionSize.y() - srcHeight);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;

				args.dst = args.src;
			}
			else
			{
				const int	srcWidth	= rnd.getInt(1, srcSize.x());
				const int	srcHeight	= rnd.getInt(1, srcSize.y());
				const int	srcX		= rnd.getInt(0, srcSize.x() - srcWidth);
				const int	srcY		= rnd.getInt(0, srcSize.y() - srcHeight);
				const int	dstWidth	= rnd.getInt(1, dstSize.x());
				const int	dstHeight	= rnd.getInt(1, dstSize.y());
				const int	dstX		= rnd.getInt(-(dstWidth / 2), dstSize.x() - (dstWidth+1) / 2);		// allow dst go out of bounds
				const int	dstY		= rnd.getInt(-(dstHeight / 2), dstSize.y() - (dstHeight+1)  / 2);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;
				args.dst.x() = dstX;
				args.dst.y() = dstY;
				args.dst.z() = dstX + dstWidth;
				args.dst.w() = dstY + dstHeight;
			}

			args.bboxMin.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.w() = rnd.getFloat( 0.9f, 1.1f);

			args.bboxMax.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.w() = rnd.getFloat( 0.9f, 1.1f);

			if (args.bboxMin.x() / args.bboxMin.w() > args.bboxMax.x() / args.bboxMax.w())
				std::swap(args.bboxMin.x(), args.bboxMax.x());
			if (args.bboxMin.y() / args.bboxMin.w() > args.bboxMax.y() / args.bboxMax.w())
				std::swap(args.bboxMin.y(), args.bboxMax.y());
			if (args.bboxMin.z() / args.bboxMin.w() > args.bboxMax.z() / args.bboxMax.w())
				std::swap(args.bboxMin.z(), args.bboxMax.z());

			args.linear = rnd.getBool();

			m_iterations.push_back(args);
		}
	}
}